

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.cpp
# Opt level: O2

int os_time(lua_State *L)

{
  int iVar1;
  int iVar2;
  long lVar3;
  tm ts;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    lVar3 = time((time_t *)0x0);
  }
  else {
    luaL_checktype(L,1,5);
    lua_settop(L,1);
    ts.tm_sec = getfield(L,"sec",0);
    ts.tm_min = getfield(L,"min",0);
    ts.tm_hour = getfield(L,"hour",0xc);
    iVar2 = -1;
    ts.tm_mday = getfield(L,"day",-1);
    iVar1 = getfield(L,"month",-1);
    ts.tm_mon = iVar1 + -1;
    iVar1 = getfield(L,"year",-1);
    ts.tm_year = iVar1 + -0x76c;
    lua_getfield(L,-1,"isdst");
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      iVar2 = lua_toboolean(L,-1);
    }
    lua_settop(L,-2);
    ts.tm_isdst = iVar2;
    lVar3 = mktime((tm *)&ts);
  }
  if (lVar3 == -1) {
    lua_pushnil(L);
  }
  else {
    lua_pushnumber(L,(double)lVar3);
  }
  return 1;
}

Assistant:

static int os_time (lua_State *L) {
  time_t t;
  if (lua_isnoneornil(L, 1))  /* called without args? */
    t = time(NULL);  /* get current time */
  else {
    struct tm ts;
    luaL_checktype(L, 1, LUA_TTABLE);
    lua_settop(L, 1);  /* make sure table is at the top */
    ts.tm_sec = getfield(L, "sec", 0);
    ts.tm_min = getfield(L, "min", 0);
    ts.tm_hour = getfield(L, "hour", 12);
    ts.tm_mday = getfield(L, "day", -1);
    ts.tm_mon = getfield(L, "month", -1) - 1;
    ts.tm_year = getfield(L, "year", -1) - 1900;
    ts.tm_isdst = getboolfield(L, "isdst");
    t = mktime(&ts);
  }
  if (t == (time_t)(-1))
    lua_pushnil(L);
  else
    lua_pushnumber(L, (lua_Number)t);
  return 1;
}